

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseModuleCommand(WastParser *this,Script *script,CommandPtr *out_command)

{
  bool bVar1;
  Result RVar2;
  ScriptModuleType SVar3;
  pointer pSVar4;
  TextScriptModule *pTVar5;
  pointer pSVar6;
  DataScriptModule<(wabt::ScriptModuleType)1> *pDVar7;
  reference pEVar8;
  pointer pMVar9;
  uchar *puVar10;
  Errors *errors_00;
  pointer lexer_00;
  char *pcVar11;
  undefined8 uVar12;
  pointer pMVar13;
  size_type sVar14;
  ulong uVar15;
  string_view filename_00;
  Binding local_1f0;
  Index local_1c8;
  Enum local_1c4;
  Index command_index;
  size_t local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  char *local_1a0;
  size_t local_198;
  undefined8 local_190;
  undefined8 local_188;
  reference local_180;
  Error *error_1;
  iterator __end2;
  iterator __begin2;
  Errors *__range2;
  undefined1 auStack_158 [4];
  Result result;
  char *local_150;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> local_148;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> lexer;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> m;
  char *filename;
  Errors errors;
  DataScriptModule<(wabt::ScriptModuleType)2> *qsm;
  __single_object command;
  Error *error;
  iterator __end3;
  iterator __begin3;
  Errors *__range3;
  char *filename_1;
  Errors errors_1;
  ReadBinaryOptions options;
  DataScriptModule<(wabt::ScriptModuleType)1> *bsm;
  __single_object command_2;
  __single_object command_1;
  Module *module;
  unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_> local_30;
  unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_> script_module;
  CommandPtr *out_command_local;
  Script *script_local;
  WastParser *this_local;
  
  script_module._M_t.
  super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>._M_t.
  super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>.
  super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>,_true,_true>)
       (__uniq_ptr_data<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>,_true,_true>)
       out_command;
  std::unique_ptr<wabt::ScriptModule,std::default_delete<wabt::ScriptModule>>::
  unique_ptr<std::default_delete<wabt::ScriptModule>,void>
            ((unique_ptr<wabt::ScriptModule,std::default_delete<wabt::ScriptModule>> *)&local_30);
  RVar2 = ParseScriptModule(this,&local_30);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    command_1._M_t.
    super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t.
    super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
    super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl =
         (__uniq_ptr_data<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>,_true,_true>
         )(__uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>)0x0;
    pSVar4 = std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::
             operator->(&local_30);
    SVar3 = ScriptModule::type(pSVar4);
    if (SVar3 == Text) {
      std::make_unique<wabt::ModuleCommand>();
      pMVar9 = std::unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>::
               operator->((unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                           *)&command_2);
      command_1._M_t.
      super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t.
      super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
      super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl =
           (__uniq_ptr_data<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>,_true,_true>
            )&pMVar9->module;
      pSVar4 = std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::get
                         (&local_30);
      pTVar5 = cast<wabt::TextScriptModule,wabt::ScriptModule>(pSVar4);
      Module::operator=((Module *)
                        command_1._M_t.
                        super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                        .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl,
                        &pTVar5->module);
      std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>::operator=
                ((unique_ptr<wabt::Command,std::default_delete<wabt::Command>> *)
                 script_module._M_t.
                 super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>
                 .super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl,
                 (unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> *)
                 &command_2);
      std::unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>::~unique_ptr
                ((unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> *)
                 &command_2);
    }
    else if (SVar3 == Binary) {
      std::make_unique<wabt::ScriptModuleCommand>();
      pSVar6 = std::
               unique_ptr<wabt::ScriptModuleCommand,_std::default_delete<wabt::ScriptModuleCommand>_>
               ::operator->((unique_ptr<wabt::ScriptModuleCommand,_std::default_delete<wabt::ScriptModuleCommand>_>
                             *)&bsm);
      command_1._M_t.
      super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t.
      super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
      super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl =
           (__uniq_ptr_data<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>,_true,_true>
            )&pSVar6->module;
      pSVar4 = std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::get
                         (&local_30);
      pDVar7 = cast<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,wabt::ScriptModule>(pSVar4);
      ReadBinaryOptions::ReadBinaryOptions
                ((ReadBinaryOptions *)
                 &errors_1.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      errors_1.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *(pointer *)&this->options_->features;
      std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
                ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&filename_1);
      if ((this->options_->parse_binary_modules & 1U) != 0) {
        puVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&pDVar7->data);
        sVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pDVar7->data);
        ReadBinaryIr("<text>",puVar10,sVar14,
                     (ReadBinaryOptions *)
                     &errors_1.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage,(Errors *)&filename_1,
                     (Module *)
                     command_1._M_t.
                     super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                     .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl);
      }
      std::__cxx11::string::operator=((string *)&(pSVar6->module).name,(string *)&pDVar7->name);
      (((Module *)
       command_1._M_t.
       super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t.
       super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
       super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl)->loc).filename._M_len =
           (pDVar7->loc).filename._M_len;
      (pSVar6->module).loc.filename._M_str = (pDVar7->loc).filename._M_str;
      (pSVar6->module).loc.field_1.field_1.offset = (pDVar7->loc).field_1.field_1.offset;
      *(undefined8 *)((long)&(pSVar6->module).loc.field_1 + 8) =
           *(undefined8 *)((long)&(pDVar7->loc).field_1 + 8);
      __end3 = std::vector<wabt::Error,_std::allocator<wabt::Error>_>::begin
                         ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&filename_1);
      error = (Error *)std::vector<wabt::Error,_std::allocator<wabt::Error>_>::end
                                 ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&filename_1);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<wabt::Error_*,_std::vector<wabt::Error,_std::allocator<wabt::Error>_>_>
                                         *)&error), bVar1) {
        pEVar8 = __gnu_cxx::
                 __normal_iterator<wabt::Error_*,_std::vector<wabt::Error,_std::allocator<wabt::Error>_>_>
                 ::operator*(&__end3);
        if ((pEVar8->loc).field_1.field_1.offset == 0xffffffffffffffff) {
          pcVar11 = (char *)std::__cxx11::string::c_str();
          Error(this,0x2536ea,pcVar11);
        }
        else {
          command._M_t.
          super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t
          .super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
          super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl =
               (__uniq_ptr_data<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>,_true,_true>
                )(pDVar7->loc).filename._M_len;
          pcVar11 = (char *)(pEVar8->loc).field_1.field_1.offset;
          uVar12 = std::__cxx11::string::c_str();
          Error(this,0x253705,pcVar11,uVar12);
        }
        __gnu_cxx::
        __normal_iterator<wabt::Error_*,_std::vector<wabt::Error,_std::allocator<wabt::Error>_>_>::
        operator++(&__end3);
      }
      pSVar6 = std::
               unique_ptr<wabt::ScriptModuleCommand,_std::default_delete<wabt::ScriptModuleCommand>_>
               ::operator->((unique_ptr<wabt::ScriptModuleCommand,_std::default_delete<wabt::ScriptModuleCommand>_>
                             *)&bsm);
      std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::operator=
                (&pSVar6->script_module,&local_30);
      std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>::operator=
                ((unique_ptr<wabt::Command,std::default_delete<wabt::Command>> *)
                 script_module._M_t.
                 super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>
                 .super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl,
                 (unique_ptr<wabt::ScriptModuleCommand,_std::default_delete<wabt::ScriptModuleCommand>_>
                  *)&bsm);
      std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
                ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&filename_1);
      std::unique_ptr<wabt::ScriptModuleCommand,_std::default_delete<wabt::ScriptModuleCommand>_>::
      ~unique_ptr((unique_ptr<wabt::ScriptModuleCommand,_std::default_delete<wabt::ScriptModuleCommand>_>
                   *)&bsm);
    }
    else if (SVar3 == Quoted) {
      std::make_unique<wabt::ModuleCommand>();
      pMVar9 = std::unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>::
               operator->((unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                           *)&qsm);
      command_1._M_t.
      super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t.
      super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
      super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl =
           (__uniq_ptr_data<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>,_true,_true>
            )&pMVar9->module;
      pSVar4 = std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::get
                         (&local_30);
      errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)cast<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,wabt::ScriptModule>
                              (pSVar4);
      std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
                ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&filename);
      std::unique_ptr<wabt::Module,std::default_delete<wabt::Module>>::
      unique_ptr<std::default_delete<wabt::Module>,void>
                ((unique_ptr<wabt::Module,std::default_delete<wabt::Module>> *)&lexer);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_158,"<text>");
      puVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage[1].loc);
      errors_00 = (Errors *)
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage[1].loc);
      filename_00._M_str = _auStack_158;
      filename_00._M_len = (size_t)&local_148;
      WastLexer::CreateBufferLexer(filename_00,local_150,(size_t)puVar10,errors_00);
      lexer_00 = std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::get
                           (&local_148);
      RVar2 = ParseWatModule(lexer_00,(unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>
                                       *)&lexer,(Errors *)&filename,this->options_);
      __end2 = std::vector<wabt::Error,_std::allocator<wabt::Error>_>::begin
                         ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&filename);
      error_1 = (Error *)std::vector<wabt::Error,_std::allocator<wabt::Error>_>::end
                                   ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&filename);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<wabt::Error_*,_std::vector<wabt::Error,_std::allocator<wabt::Error>_>_>
                                         *)&error_1), bVar1) {
        local_180 = __gnu_cxx::
                    __normal_iterator<wabt::Error_*,_std::vector<wabt::Error,_std::allocator<wabt::Error>_>_>
                    ::operator*(&__end2);
        if ((local_180->loc).field_1.field_1.offset == 0xffffffffffffffff) {
          local_1a0 = ((errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage)->loc).filename._M_str;
          local_198 = ((errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage)->loc).field_1.field_1.offset;
          local_190 = *(undefined8 *)
                       ((long)&((errors.
                                 super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage)->loc).field_1 +
                       8);
          local_188 = *(undefined8 *)
                       &(errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage)->message;
          pcVar11 = (char *)std::__cxx11::string::c_str();
          Error(this,0x25372a,pcVar11);
        }
        else {
          _command_index =
               ((errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage)->loc).filename._M_str;
          local_1b8 = ((errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage)->loc).field_1.field_1.offset;
          local_1b0 = *(undefined8 *)
                       ((long)&((errors.
                                 super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage)->loc).field_1 +
                       8);
          local_1a8 = *(undefined8 *)
                       &(errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage)->message;
          pcVar11 = (char *)(local_180->loc).field_1.field_1.offset;
          uVar12 = std::__cxx11::string::c_str();
          Error(this,0x253745,pcVar11,uVar12);
        }
        __gnu_cxx::
        __normal_iterator<wabt::Error_*,_std::vector<wabt::Error,_std::allocator<wabt::Error>_>_>::
        operator++(&__end2);
      }
      local_1c4 = RVar2.enum_;
      bVar1 = Succeeded(RVar2);
      if (bVar1) {
        pMVar13 = std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::get
                            ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)&lexer)
        ;
        Module::operator=((Module *)
                          command_1._M_t.
                          super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                          .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl,pMVar13)
        ;
      }
      std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>::operator=
                ((unique_ptr<wabt::Command,std::default_delete<wabt::Command>> *)
                 script_module._M_t.
                 super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>
                 .super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl,
                 (unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> *)&qsm)
      ;
      std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::~unique_ptr
                (&local_148);
      std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::~unique_ptr
                ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)&lexer);
      std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
                ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&filename);
      std::unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>::~unique_ptr
                ((unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> *)&qsm)
      ;
    }
    if (script != (Script *)0x0) {
      sVar14 = std::
               vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
               ::size(&script->commands);
      local_1c8 = (Index)sVar14;
      uVar15 = std::__cxx11::string::empty();
      if ((uVar15 & 1) == 0) {
        Binding::Binding(&local_1f0,
                         (Location *)
                         command_1._M_t.
                         super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                         .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl,local_1c8
                        );
        std::
        unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
        ::emplace<std::__cxx11::string&,wabt::Binding>
                  ((unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                    *)&script->module_bindings,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)command_1._M_t.
                          super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                          .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x20),
                   &local_1f0);
      }
      this->last_module_index_ = local_1c8;
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::~unique_ptr
            (&local_30);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseModuleCommand(Script* script, CommandPtr* out_command) {
  WABT_TRACE(ParseModuleCommand);
  std::unique_ptr<ScriptModule> script_module;
  CHECK_RESULT(ParseScriptModule(&script_module));

  Module* module = nullptr;

  switch (script_module->type()) {
    case ScriptModuleType::Text: {
      auto command = std::make_unique<ModuleCommand>();
      module = &command->module;
      *module = std::move(cast<TextScriptModule>(script_module.get())->module);
      *out_command = std::move(command);
      break;
    }

    case ScriptModuleType::Binary: {
      auto command = std::make_unique<ScriptModuleCommand>();
      module = &command->module;
      auto* bsm = cast<BinaryScriptModule>(script_module.get());
      ReadBinaryOptions options;
#if WABT_TRACING
      auto log_stream = FileStream::CreateStdout();
      options.log_stream = log_stream.get();
#endif
      options.features = options_->features;
      Errors errors;
      const char* filename = "<text>";
      if (options_->parse_binary_modules) {
        ReadBinaryIr(filename, bsm->data.data(), bsm->data.size(), options,
                     &errors, module);
      }
      module->name = bsm->name;
      module->loc = bsm->loc;
      for (const auto& error : errors) {
        if (error.loc.offset == kInvalidOffset) {
          Error(bsm->loc, "error in binary module: %s", error.message.c_str());
        } else {
          Error(bsm->loc, "error in binary module: @0x%08" PRIzx ": %s",
                error.loc.offset, error.message.c_str());
        }
      }

      command->script_module = std::move(script_module);
      *out_command = std::move(command);
      break;
    }

    case ScriptModuleType::Quoted:
      auto command = std::make_unique<ModuleCommand>();
      module = &command->module;
      auto* qsm = cast<QuotedScriptModule>(script_module.get());
      Errors errors;
      const char* filename = "<text>";
      std::unique_ptr<Module> m;
      std::unique_ptr<WastLexer> lexer = WastLexer::CreateBufferLexer(
          filename, qsm->data.data(), qsm->data.size(), &errors);
      auto result = ParseWatModule(lexer.get(), &m, &errors, options_);
      for (const auto& error : errors) {
        if (error.loc.offset == kInvalidOffset) {
          Error(qsm->loc, "error in quoted module: %s", error.message.c_str());
        } else {
          Error(qsm->loc, "error in quoted module: @0x%08" PRIzx ": %s",
                error.loc.offset, error.message.c_str());
        }
      }
      if (Succeeded(result)) {
        *module = std::move(*m.get());
      }
      *out_command = std::move(command);
      break;
  }

  // script is nullptr when ParseModuleCommand is called from ParseModule.
  if (script) {
    Index command_index = script->commands.size();

    if (!module->name.empty()) {
      script->module_bindings.emplace(module->name,
                                      Binding(module->loc, command_index));
    }

    last_module_index_ = command_index;
  }

  return Result::Ok;
}